

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

DeepFrameBuffer * __thiscall Imf_3_2::DeepTiledInputFile::frameBuffer(DeepTiledInputFile *this)

{
  mutex_type *pmVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = in_RDI[1]._M_device;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1aef44);
  return (DeepFrameBuffer *)(pmVar1 + 3);
}

Assistant:

const DeepFrameBuffer&
DeepTiledInputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    return _data->frameBuffer;
}